

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_gsupport.cpp
# Opt level: O0

void __kmp_GOMP_doacross_post<long,true>(long *count)

{
  long lVar1;
  int gtid_00;
  kmp_int64 *vec_00;
  long in_RDI;
  kmp_int64 i;
  kmp_int64 *vec;
  kmp_int64 num_dims;
  kmp_info_t *th;
  int gtid;
  void *in_stack_ffffffffffffffc8;
  kmp_info_t *in_stack_ffffffffffffffd0;
  kmp_info_t *th_00;
  
  gtid_00 = __kmp_get_global_thread_id_reg();
  lVar1 = *(((__kmp_threads[gtid_00]->th).th_dispatch)->field_8).th_doacross_info;
  vec_00 = (kmp_int64 *)
           ___kmp_thread_malloc(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
  for (th_00 = (kmp_info_t *)0x0; (long)th_00 < lVar1; th_00 = (kmp_info_t *)(th_00->th_pad + 1)) {
    vec_00[(long)th_00] = *(kmp_int64 *)(in_RDI + (long)th_00 * 8);
  }
  __kmpc_doacross_post(&__kmp_GOMP_doacross_post<long,_true>::loc,gtid_00,vec_00);
  ___kmp_thread_free(th_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void __kmp_GOMP_doacross_post<long, true>(long *count) {
  int gtid = __kmp_entry_gtid();
  kmp_info_t *th = __kmp_threads[gtid];
  MKLOC(loc, "GOMP_doacross_post");
  kmp_int64 num_dims = th->th.th_dispatch->th_doacross_info[0];
  kmp_int64 *vec =
      (kmp_int64 *)__kmp_thread_malloc(th, sizeof(kmp_int64) * num_dims);
  for (kmp_int64 i = 0; i < num_dims; ++i) {
    vec[i] = (kmp_int64)count[i];
  }
  __kmpc_doacross_post(&loc, gtid, vec);
  __kmp_thread_free(th, vec);
}